

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O2

ChainPosition __thiscall S2LaxPolygonShape::chain_position(S2LaxPolygonShape *this,int e)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint *puVar5;
  uint *puVar6;
  anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 *paVar7;
  ulong uVar8;
  uint *puVar9;
  S2LogMessage local_20;
  
  iVar2 = *(int *)&(this->super_S2Shape).field_0xc;
  lVar3 = (long)iVar2;
  puVar9 = (this->field_2).cumulative_vertices_;
  paVar7 = (anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 *)(puVar9 + lVar3);
  if (lVar3 < 2) {
    paVar7 = &this->field_2;
  }
  if (paVar7->num_vertices_ <= e) {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0xe0,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_20.stream_,"Check failed: (e) < (num_edges()) ");
    abort();
  }
  uVar8 = (ulong)(uint)e;
  if (iVar2 == 1) {
    uVar4 = 0;
  }
  else {
    puVar5 = puVar9;
    if (iVar2 < 0xd) {
      do {
        puVar6 = puVar5 + 1;
        puVar1 = puVar5 + 1;
        puVar5 = puVar6;
      } while (*puVar1 <= (uint)e);
    }
    else {
      local_20.severity_ = e + kWarning;
      puVar6 = std::__lower_bound<unsigned_int*,int,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar9 + 1,puVar9 + 1 + lVar3);
      puVar9 = (this->field_2).cumulative_vertices_;
    }
    uVar8 = (ulong)(e - puVar6[-1]);
    uVar4 = (ulong)((long)puVar6 + (-4 - (long)puVar9)) >> 2 & 0xffffffff;
  }
  return (ChainPosition)(uVar8 << 0x20 | uVar4);
}

Assistant:

S2LaxPolygonShape::~S2LaxPolygonShape() {
  if (num_loops() > 1) {
    delete[] cumulative_vertices_;
  }
}